

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clagge.c
# Opt level: O2

int clagge_slu(int *m,int *n,int *kl,int *ku,float *d,singlecomplex *a,int *lda,int *iseed,
              singlecomplex *work,int *info)

{
  int iVar1;
  double dVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  singlecomplex *psVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  float *pfVar14;
  int iVar15;
  int unaff_R13D;
  int iVar16;
  uint *puVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar22;
  int local_b4;
  singlecomplex local_b0;
  int local_a8;
  int local_a4;
  int *local_a0;
  int *local_98;
  singlecomplex *local_90;
  uint *local_88;
  uint *local_80;
  undefined1 local_78 [16];
  singlecomplex *local_60;
  undefined1 local_58 [16];
  ulong local_48;
  singlecomplex *local_40;
  long local_38;
  
  iVar1 = *lda;
  uVar19 = (ulong)iVar1;
  *info = 0;
  uVar4 = *m;
  local_98 = m;
  if ((int)uVar4 < 0) {
    local_a4 = 1;
    iVar1 = -1;
  }
  else {
    uVar11 = *n;
    if ((int)uVar11 < 0) {
      local_a4 = 2;
      iVar1 = -2;
    }
    else if ((uint)*kl < uVar4) {
      if ((uint)*ku < uVar11) {
        if ((int)uVar4 <= *lda) {
          local_48 = ~uVar19;
          local_90 = a + local_48;
          lVar9 = uVar19 * 8;
          psVar7 = a + uVar19 + local_48;
          iVar5 = iVar1;
          local_a8 = unaff_R13D;
          for (lVar18 = 1; lVar13 = 1, lVar18 != (ulong)uVar11 + 1; lVar18 = lVar18 + 1) {
            for (; (ulong)uVar4 + 1 != lVar13; lVar13 = lVar13 + 1) {
              psVar7[lVar13].r = 0.0;
              psVar7[lVar13].i = 0.0;
              local_a8 = (int)lVar13 + iVar5;
            }
            iVar5 = iVar5 + iVar1;
            psVar7 = psVar7 + uVar19;
          }
          if ((int)uVar4 < (int)uVar11) {
            uVar11 = uVar4;
          }
          uVar19 = (ulong)uVar11;
          iVar16 = iVar1 + 1;
          iVar5 = 1;
          local_b4 = iVar1;
          iVar10 = iVar16;
          for (uVar6 = 0; uVar19 != uVar6; uVar6 = uVar6 + 1) {
            local_90[iVar10].r = d[uVar6];
            local_90[iVar10].i = 0.0;
            local_b4 = iVar16 * iVar5;
            iVar5 = iVar5 + 1;
            iVar10 = iVar10 + iVar16;
          }
          local_78._8_8_ = local_78._0_8_;
          local_78._0_8_ = work + 1;
          local_60 = (singlecomplex *)CONCAT44(local_60._4_4_,iVar16);
          local_a0 = n;
          local_88 = (uint *)ku;
          local_80 = (uint *)kl;
          local_40 = a;
          local_38 = lVar9;
          while( true ) {
            clagge_slu::i = (int)uVar19;
            iVar5 = *m;
            if (clagge_slu::i < 1) break;
            if (iVar5 - clagge_slu::i != 0 && clagge_slu::i <= iVar5) {
              local_a4 = (iVar5 - clagge_slu::i) + 1;
              clarnv_slu(&c__3,iseed,&local_a4,work);
              local_a4 = (*m - clagge_slu::i) + 1;
              clagge_slu::wn = scnrm2_(&local_a4,work,&c__1);
              local_58._8_4_ = extraout_XMM0_Dc;
              local_58._0_8_ = (double)clagge_slu::wn;
              local_58._12_4_ = extraout_XMM0_Dd;
              dVar2 = c_abs(work);
              fVar20 = (float)(((double)local_58._0_8_ / dVar2) * (double)(*work).r);
              fVar21 = (float)(((double)local_58._0_8_ / dVar2) * (double)(*work).i);
              local_b0.i = fVar21;
              local_b0.r = fVar20;
              clagge_slu::wa.i = fVar21;
              clagge_slu::wa.r = fVar20;
              if ((clagge_slu::wn != 0.0) || (fVar22 = 0.0, NAN(clagge_slu::wn))) {
                clagge_slu::wb.r = (*work).r + fVar20;
                clagge_slu::wb.i = (*work).i + fVar21;
                local_a4 = *m - clagge_slu::i;
                local_b0 = clagge_slu::wb;
                c_div(&local_b0,&c_b2,&clagge_slu::wb);
                cscal_(&local_a4,&local_b0,(singlecomplex *)local_78._0_8_,&c__1);
                work->r = 1.0;
                work->i = 0.0;
                c_div(&local_b0,&clagge_slu::wb,&clagge_slu::wa);
                fVar22 = local_b0.r;
              }
              psVar7 = local_90;
              piVar8 = local_a0;
              local_a4 = (*m - clagge_slu::i) + 1;
              local_b4 = (*local_a0 - clagge_slu::i) + 1;
              iVar5 = (int)local_60;
              clagge_slu_tau_0 = fVar22;
              cgemv_("Conjugate transpose",&local_a4,&local_b4,&c_b2,
                     local_90 + clagge_slu::i * (int)local_60,lda,work,&c__1,&c_b1,work + *m,&c__1);
              m = local_98;
              local_a4 = (*local_98 - clagge_slu::i) + 1;
              local_b4 = (*piVar8 - clagge_slu::i) + 1;
              local_b0.i = -0.0;
              local_b0.r = -clagge_slu_tau_0;
              cgerc_(&local_a4,&local_b4,&local_b0,work,&c__1,work + *local_98,&c__1,
                     psVar7 + clagge_slu::i * iVar5,lda);
            }
            local_a4 = *local_a0 - clagge_slu::i;
            if (local_a4 != 0 && clagge_slu::i <= *local_a0) {
              local_a4 = local_a4 + 1;
              clarnv_slu(&c__3,iseed,&local_a4,work);
              piVar8 = local_a0;
              local_a4 = (*local_a0 - clagge_slu::i) + 1;
              clagge_slu::wn = scnrm2_(&local_a4,work,&c__1);
              local_58._8_4_ = extraout_XMM0_Dc_00;
              local_58._0_8_ = (double)clagge_slu::wn;
              local_58._12_4_ = extraout_XMM0_Dd_00;
              dVar2 = c_abs(work);
              fVar20 = (float)(((double)local_58._0_8_ / dVar2) * (double)(*work).r);
              fVar21 = (float)(((double)local_58._0_8_ / dVar2) * (double)(*work).i);
              local_b0.i = fVar21;
              local_b0.r = fVar20;
              clagge_slu::wa.i = fVar21;
              clagge_slu::wa.r = fVar20;
              if ((clagge_slu::wn != 0.0) || (fVar22 = 0.0, NAN(clagge_slu::wn))) {
                clagge_slu::wb.r = (*work).r + fVar20;
                clagge_slu::wb.i = (*work).i + fVar21;
                local_a4 = *piVar8 - clagge_slu::i;
                local_b0 = clagge_slu::wb;
                c_div(&local_b0,&c_b2,&clagge_slu::wb);
                cscal_(&local_a4,&local_b0,(singlecomplex *)local_78._0_8_,&c__1);
                work->r = 1.0;
                work->i = 0.0;
                c_div(&local_b0,&clagge_slu::wb,&clagge_slu::wa);
                fVar22 = local_b0.r;
              }
              psVar7 = local_90;
              local_a4 = (*m - clagge_slu::i) + 1;
              local_b4 = (*piVar8 - clagge_slu::i) + 1;
              iVar5 = (int)local_60;
              clagge_slu_tau_0 = fVar22;
              cgemv_("No transpose",&local_a4,&local_b4,&c_b2,
                     local_90 + clagge_slu::i * (int)local_60,lda,work,&c__1,&c_b1,work + *piVar8,
                     &c__1);
              m = local_98;
              local_a4 = (*local_98 - clagge_slu::i) + 1;
              local_b4 = (*piVar8 - clagge_slu::i) + 1;
              local_b0.i = -0.0;
              local_b0.r = -clagge_slu_tau_0;
              cgerc_(&local_a4,&local_b4,&local_b0,work + *piVar8,&c__1,work,&c__1,
                     psVar7 + clagge_slu::i * iVar5,lda);
              lVar9 = local_38;
            }
            uVar19 = (ulong)(clagge_slu::i - 1);
          }
          uVar4 = *local_80;
          iVar10 = *local_a0;
          uVar11 = *local_88;
          local_a8 = ~uVar11 + iVar10;
          local_a4 = local_a8;
          if (local_a8 < (int)(~uVar4 + iVar5)) {
            local_a4 = ~uVar4 + iVar5;
          }
          local_60 = local_40 + local_48 + 1;
          local_58._0_4_ = iVar1 + 1;
          puVar17 = local_80;
          for (iVar16 = 1; psVar7 = local_90, iVar16 <= local_a4; iVar16 = iVar16 + 1) {
            clagge_slu::i = iVar16;
            if ((int)uVar11 < (int)uVar4) {
              iVar12 = ~uVar11 + iVar10;
              if (iVar5 <= (int)(~uVar11 + iVar10)) {
                iVar12 = iVar5;
              }
              if (iVar16 <= iVar12) {
                local_b4 = (iVar10 - (uVar11 + iVar16)) + 1;
                clagge_slu::wn =
                     scnrm2_(&local_b4,local_90 + (int)((uVar11 + iVar16) * iVar1 + iVar16),lda);
                puVar17 = local_88;
                local_78._8_4_ = extraout_XMM0_Dc_01;
                local_78._0_8_ = (double)clagge_slu::wn;
                local_78._12_4_ = extraout_XMM0_Dd_01;
                dVar2 = c_abs(psVar7 + (int)((*local_88 + clagge_slu::i) * iVar1 + clagge_slu::i));
                local_b4 = *puVar17 + clagge_slu::i;
                lVar18 = (long)(local_b4 * iVar1 + clagge_slu::i);
                clagge_slu::wa.r =
                     (float)(((double)local_78._0_8_ / dVar2) * (double)psVar7[lVar18].r);
                clagge_slu::wa.i =
                     (float)(((double)local_78._0_8_ / dVar2) * (double)psVar7[lVar18].i);
                fVar20 = 0.0;
                if ((clagge_slu::wn != 0.0) || (local_b0 = clagge_slu::wa, NAN(clagge_slu::wn))) {
                  fVar20 = psVar7[lVar18].r + clagge_slu::wa.r;
                  fVar21 = psVar7[lVar18].i + clagge_slu::wa.i;
                  local_b0.i = fVar21;
                  local_b0.r = fVar20;
                  clagge_slu::wb.i = fVar21;
                  clagge_slu::wb.r = fVar20;
                  local_b4 = *local_a0 - local_b4;
                  c_div(&local_b0,&c_b2,&clagge_slu::wb);
                  cscal_(&local_b4,&local_b0,
                         psVar7 + (int)((*puVar17 + clagge_slu::i + 1) * iVar1 + clagge_slu::i),lda)
                  ;
                  local_b4 = (*puVar17 + clagge_slu::i) * iVar1 + clagge_slu::i;
                  psVar7[local_b4].r = 1.0;
                  psVar7[local_b4].i = 0.0;
                  c_div(&local_b0,&clagge_slu::wb,&clagge_slu::wa);
                  local_b4 = *puVar17 + clagge_slu::i;
                  lVar18 = (long)(local_b4 * iVar1 + clagge_slu::i);
                  fVar20 = local_b0.r;
                }
                piVar8 = local_a0;
                local_b4 = (*local_a0 - local_b4) + 1;
                clagge_slu_tau_0 = fVar20;
                clacgv_slu(&local_b4,psVar7 + lVar18,lda);
                local_b4 = *local_98 - clagge_slu::i;
                local_a8 = (*piVar8 - (*puVar17 + clagge_slu::i)) + 1;
                iVar5 = (*puVar17 + clagge_slu::i) * iVar1;
                cgemv_("No transpose",&local_b4,&local_a8,&c_b2,
                       local_90 + (clagge_slu::i + iVar5 + 1),lda,local_90 + (iVar5 + clagge_slu::i)
                       ,lda,&c_b1,work,&c__1);
                psVar7 = local_90;
                piVar3 = local_98;
                local_b4 = *local_98 - clagge_slu::i;
                local_a8 = (*piVar8 - (*local_88 + clagge_slu::i)) + 1;
                local_b0.i = -0.0;
                local_b0.r = -clagge_slu_tau_0;
                iVar5 = (*local_88 + clagge_slu::i) * iVar1;
                cgerc_(&local_b4,&local_a8,&local_b0,work,&c__1,local_90 + (iVar5 + clagge_slu::i),
                       lda,local_90 + (iVar5 + 1 + clagge_slu::i),lda);
                iVar16 = clagge_slu::i;
                local_b0 = (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                psVar7[(int)((*local_88 + clagge_slu::i) * iVar1 + clagge_slu::i)] =
                     (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                iVar5 = *piVar3;
                uVar4 = *local_80;
                iVar10 = *local_a0;
                puVar17 = local_80;
              }
              iVar12 = ~uVar4 + iVar5;
              if (iVar10 <= (int)(~uVar4 + iVar5)) {
                iVar12 = iVar10;
              }
              piVar8 = local_98;
              if (iVar16 <= iVar12) {
                local_b4 = (iVar5 - (uVar4 + iVar16)) + 1;
                clagge_slu::wn =
                     scnrm2_(&local_b4,psVar7 + (int)(iVar16 * iVar1 + uVar4 + iVar16),&c__1);
                local_78._8_4_ = extraout_XMM0_Dc_03;
                local_78._0_8_ = (double)clagge_slu::wn;
                local_78._12_4_ = extraout_XMM0_Dd_03;
                dVar2 = c_abs(psVar7 + (int)(clagge_slu::i * iVar1 + *puVar17 + clagge_slu::i));
                piVar8 = local_98;
                iVar5 = *puVar17 + clagge_slu::i;
                lVar18 = (long)(clagge_slu::i * iVar1 + iVar5);
                clagge_slu::wa.r =
                     (float)(((double)local_78._0_8_ / dVar2) * (double)psVar7[lVar18].r);
                clagge_slu::wa.i =
                     (float)(((double)local_78._0_8_ / dVar2) * (double)psVar7[lVar18].i);
                fVar20 = 0.0;
                if ((clagge_slu::wn != 0.0) || (local_b0 = clagge_slu::wa, NAN(clagge_slu::wn))) {
                  fVar20 = psVar7[lVar18].r + clagge_slu::wa.r;
                  fVar21 = psVar7[lVar18].i + clagge_slu::wa.i;
                  local_b0.i = fVar21;
                  local_b0.r = fVar20;
                  clagge_slu::wb.i = fVar21;
                  clagge_slu::wb.r = fVar20;
                  local_b4 = *local_98 - iVar5;
                  c_div(&local_b0,&c_b2,&clagge_slu::wb);
                  psVar7 = local_90;
                  cscal_(&local_b4,&local_b0,
                         local_90 + (int)(clagge_slu::i + *puVar17 + clagge_slu::i * iVar1 + 1),
                         &c__1);
                  local_b4 = clagge_slu::i * iVar1 + *puVar17 + clagge_slu::i;
                  psVar7[local_b4].r = 1.0;
                  psVar7[local_b4].i = 0.0;
                  c_div(&local_b0,&clagge_slu::wb,&clagge_slu::wa);
                  iVar5 = *puVar17 + clagge_slu::i;
                  lVar18 = (long)(clagge_slu::i * iVar1 + iVar5);
                  fVar20 = local_b0.r;
                }
                local_b4 = (*piVar8 - iVar5) + 1;
                local_a8 = *local_a0 - clagge_slu::i;
                clagge_slu_tau_0 = fVar20;
                cgemv_("Conjugate transpose",&local_b4,&local_a8,&c_b2,
                       psVar7 + ((clagge_slu::i + 1) * iVar1 + iVar5),lda,psVar7 + lVar18,&c__1,
                       &c_b1,work,&c__1);
                puVar17 = local_80;
                psVar7 = local_90;
                iVar5 = *local_80 + clagge_slu::i;
                local_b4 = (*piVar8 - iVar5) + 1;
                local_a8 = *local_a0 - clagge_slu::i;
                local_b0.i = -0.0;
                local_b0.r = -clagge_slu_tau_0;
                cgerc_(&local_b4,&local_a8,&local_b0,local_90 + (clagge_slu::i * iVar1 + iVar5),
                       &c__1,work,&c__1,local_90 + ((clagge_slu::i + 1) * iVar1 + iVar5),lda);
                uVar4 = *puVar17;
                local_b0 = (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                psVar7[(int)(clagge_slu::i * iVar1 + clagge_slu::i + uVar4)] =
                     (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                iVar16 = clagge_slu::i;
              }
            }
            else {
              iVar12 = ~uVar4 + iVar5;
              if (iVar10 <= (int)(~uVar4 + iVar5)) {
                iVar12 = iVar10;
              }
              if (iVar16 <= iVar12) {
                local_b4 = (iVar5 - (uVar4 + iVar16)) + 1;
                clagge_slu::wn =
                     scnrm2_(&local_b4,local_90 + (int)(iVar16 * iVar1 + uVar4 + iVar16),&c__1);
                local_78._8_4_ = extraout_XMM0_Dc_02;
                local_78._0_8_ = (double)clagge_slu::wn;
                local_78._12_4_ = extraout_XMM0_Dd_02;
                dVar2 = c_abs(psVar7 + (int)(clagge_slu::i * iVar1 + *puVar17 + clagge_slu::i));
                piVar8 = local_98;
                iVar5 = *puVar17 + clagge_slu::i;
                lVar18 = (long)(clagge_slu::i * iVar1 + iVar5);
                clagge_slu::wa.r =
                     (float)(((double)local_78._0_8_ / dVar2) * (double)psVar7[lVar18].r);
                clagge_slu::wa.i =
                     (float)(((double)local_78._0_8_ / dVar2) * (double)psVar7[lVar18].i);
                fVar20 = 0.0;
                if ((clagge_slu::wn != 0.0) || (local_b0 = clagge_slu::wa, NAN(clagge_slu::wn))) {
                  fVar20 = psVar7[lVar18].r + clagge_slu::wa.r;
                  fVar21 = psVar7[lVar18].i + clagge_slu::wa.i;
                  local_b0.i = fVar21;
                  local_b0.r = fVar20;
                  clagge_slu::wb.i = fVar21;
                  clagge_slu::wb.r = fVar20;
                  local_b4 = *local_98 - iVar5;
                  c_div(&local_b0,&c_b2,&clagge_slu::wb);
                  cscal_(&local_b4,&local_b0,
                         psVar7 + (int)(clagge_slu::i + *puVar17 + clagge_slu::i * iVar1 + 1),&c__1)
                  ;
                  local_b4 = clagge_slu::i * iVar1 + *puVar17 + clagge_slu::i;
                  psVar7[local_b4].r = 1.0;
                  psVar7[local_b4].i = 0.0;
                  c_div(&local_b0,&clagge_slu::wb,&clagge_slu::wa);
                  iVar5 = *puVar17 + clagge_slu::i;
                  lVar18 = (long)(clagge_slu::i * iVar1 + iVar5);
                  fVar20 = local_b0.r;
                }
                local_b4 = (*piVar8 - iVar5) + 1;
                local_a8 = *local_a0 - clagge_slu::i;
                clagge_slu_tau_0 = fVar20;
                cgemv_("Conjugate transpose",&local_b4,&local_a8,&c_b2,
                       psVar7 + ((clagge_slu::i + 1) * iVar1 + iVar5),lda,psVar7 + lVar18,&c__1,
                       &c_b1,work,&c__1);
                puVar17 = local_80;
                psVar7 = local_90;
                iVar5 = *local_80 + clagge_slu::i;
                local_b4 = (*piVar8 - iVar5) + 1;
                local_a8 = *local_a0 - clagge_slu::i;
                local_b0.i = -0.0;
                local_b0.r = -clagge_slu_tau_0;
                cgerc_(&local_b4,&local_a8,&local_b0,local_90 + (clagge_slu::i * iVar1 + iVar5),
                       &c__1,work,&c__1,local_90 + ((clagge_slu::i + 1) * iVar1 + iVar5),lda);
                iVar16 = clagge_slu::i;
                uVar4 = *puVar17;
                local_b0 = (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                psVar7[(int)(clagge_slu::i * iVar1 + clagge_slu::i + uVar4)] =
                     (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                iVar10 = *local_a0;
                uVar11 = *local_88;
                iVar5 = *piVar8;
              }
              psVar7 = local_90;
              iVar12 = ~uVar11 + iVar10;
              if (iVar5 <= (int)(~uVar11 + iVar10)) {
                iVar12 = iVar5;
              }
              piVar8 = local_98;
              if (iVar16 <= iVar12) {
                local_b4 = (iVar10 - (uVar11 + iVar16)) + 1;
                clagge_slu::wn =
                     scnrm2_(&local_b4,local_90 + (int)((uVar11 + iVar16) * iVar1 + iVar16),lda);
                puVar17 = local_88;
                local_78._8_4_ = extraout_XMM0_Dc_04;
                local_78._0_8_ = (double)clagge_slu::wn;
                local_78._12_4_ = extraout_XMM0_Dd_04;
                dVar2 = c_abs(psVar7 + (int)((*local_88 + clagge_slu::i) * iVar1 + clagge_slu::i));
                local_b4 = *puVar17 + clagge_slu::i;
                lVar18 = (long)(local_b4 * iVar1 + clagge_slu::i);
                clagge_slu::wa.r =
                     (float)(((double)local_78._0_8_ / dVar2) * (double)psVar7[lVar18].r);
                clagge_slu::wa.i =
                     (float)(((double)local_78._0_8_ / dVar2) * (double)psVar7[lVar18].i);
                fVar20 = 0.0;
                if ((clagge_slu::wn != 0.0) || (local_b0 = clagge_slu::wa, NAN(clagge_slu::wn))) {
                  fVar20 = psVar7[lVar18].r + clagge_slu::wa.r;
                  fVar21 = psVar7[lVar18].i + clagge_slu::wa.i;
                  local_b0.i = fVar21;
                  local_b0.r = fVar20;
                  clagge_slu::wb.i = fVar21;
                  clagge_slu::wb.r = fVar20;
                  local_b4 = *local_a0 - local_b4;
                  c_div(&local_b0,&c_b2,&clagge_slu::wb);
                  cscal_(&local_b4,&local_b0,
                         psVar7 + (int)((*puVar17 + clagge_slu::i + 1) * iVar1 + clagge_slu::i),lda)
                  ;
                  local_b4 = (*puVar17 + clagge_slu::i) * iVar1 + clagge_slu::i;
                  psVar7[local_b4].r = 1.0;
                  psVar7[local_b4].i = 0.0;
                  c_div(&local_b0,&clagge_slu::wb,&clagge_slu::wa);
                  local_b4 = *puVar17 + clagge_slu::i;
                  lVar18 = (long)(local_b4 * iVar1 + clagge_slu::i);
                  fVar20 = local_b0.r;
                }
                piVar8 = local_a0;
                local_b4 = (*local_a0 - local_b4) + 1;
                clagge_slu_tau_0 = fVar20;
                clacgv_slu(&local_b4,psVar7 + lVar18,lda);
                local_b4 = *local_98 - clagge_slu::i;
                local_a8 = (*piVar8 - (*local_88 + clagge_slu::i)) + 1;
                iVar5 = (*local_88 + clagge_slu::i) * iVar1;
                cgemv_("No transpose",&local_b4,&local_a8,&c_b2,psVar7 + (clagge_slu::i + iVar5 + 1)
                       ,lda,psVar7 + (iVar5 + clagge_slu::i),lda,&c_b1,work,&c__1);
                piVar8 = local_98;
                local_b4 = *local_98 - clagge_slu::i;
                local_a8 = (*local_a0 - (*local_88 + clagge_slu::i)) + 1;
                local_b0.i = -0.0;
                local_b0.r = -clagge_slu_tau_0;
                iVar5 = (*local_88 + clagge_slu::i) * iVar1;
                cgerc_(&local_b4,&local_a8,&local_b0,work,&c__1,psVar7 + (iVar5 + clagge_slu::i),lda
                       ,psVar7 + (iVar5 + clagge_slu::i + 1),lda);
                local_b0 = (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                psVar7[(int)((*local_88 + clagge_slu::i) * iVar1 + clagge_slu::i)] =
                     (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                uVar4 = *local_80;
                puVar17 = local_80;
                iVar16 = clagge_slu::i;
              }
            }
            iVar5 = *piVar8;
            iVar10 = local_58._0_4_ * iVar16 + uVar4;
            for (lVar18 = (long)(int)(iVar16 + uVar4); iVar10 = iVar10 + 1, lVar18 < iVar5;
                lVar18 = lVar18 + 1) {
              local_60[iVar1 * iVar16 + lVar18].r = 0.0;
              local_60[iVar1 * iVar16 + lVar18].i = 0.0;
              local_a8 = iVar10;
            }
            iVar10 = *local_a0;
            uVar11 = *local_88;
            lVar18 = (long)(int)(uVar11 + iVar16);
            pfVar14 = (float *)((long)&local_90[iVar16].r + (lVar18 + 1) * lVar9);
            iVar12 = (iVar16 + uVar11 + 1) * iVar1 + iVar16;
            for (; iVar15 = iVar12, lVar18 < iVar10; lVar18 = lVar18 + 1) {
              *(undefined8 *)pfVar14 = 0;
              pfVar14 = (float *)((long)pfVar14 + lVar9);
              iVar12 = iVar15 + iVar1;
              local_a8 = iVar15;
            }
          }
          clagge_slu::i = iVar16;
          return 0;
        }
        local_a4 = 7;
        iVar1 = -7;
      }
      else {
        local_a4 = 4;
        iVar1 = -4;
      }
    }
    else {
      local_a4 = 3;
      iVar1 = -3;
    }
  }
  *info = iVar1;
  input_error("CLAGGE",&local_a4);
  return 0;
}

Assistant:

int clagge_slu(int *m, int *n, int *kl, int *ku,
	 float *d, singlecomplex *a, int *lda, int *iseed, singlecomplex *work,
	int *info)
{
    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3;
    double d__1;
    singlecomplex q__1;

    /* Local variables */
    static int i, j;
    extern /* Subroutine */ int cgerc_(int *, int *, singlecomplex *,
	    singlecomplex *, int *, singlecomplex *, int *, singlecomplex *, int *),
	cscal_(int *, singlecomplex *, singlecomplex *, int *); 
    extern float scnrm2_(int *, singlecomplex *, int *);
    static singlecomplex wa, wb;
    extern /* Subroutine */ int clacgv_slu(int *, singlecomplex *, int *);
    static float wn;
    extern /* Subroutine */ int clarnv_slu(int *, int *, int *, singlecomplex *);
    extern int input_error(char *, int *);
    static singlecomplex tau;


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    CLAGGE generates a complex general m by n matrix A, by pre- and post- 
  
    multiplying a real diagonal matrix D with random unitary matrices:   
    A = U*D*V. The lower and upper bandwidths may then be reduced to   
    kl and ku by additional unitary transformations.   

    Arguments   
    =========   

    M       (input) INTEGER   
            The number of rows of the matrix A.  M >= 0.   

    N       (input) INTEGER   
            The number of columns of the matrix A.  N >= 0.   

    KL      (input) INTEGER   
            The number of nonzero subdiagonals within the band of A.   
            0 <= KL <= M-1.   

    KU      (input) INTEGER   
            The number of nonzero superdiagonals within the band of A.   
            0 <= KU <= N-1.   

    D       (input) REAL array, dimension (min(M,N))   
            The diagonal elements of the diagonal matrix D.   

    A       (output) COMPLEX array, dimension (LDA,N)   
            The generated m by n matrix A.   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= M.   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    WORK    (workspace) COMPLEX array, dimension (M+N)   

    INFO    (output) INTEGER   
            = 0: successful exit   
            < 0: if INFO = -i, the i-th argument had an illegal value   

    ===================================================================== 
  


       Test the input arguments   

       Parameter adjustments */
    --d;
    a_dim1 = *lda;
    a_offset = a_dim1 + 1;
    a -= a_offset;
    --iseed;
    --work;

    /* Function Body */
    *info = 0;
    if (*m < 0) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*kl < 0 || *kl > *m - 1) {
	*info = -3;
    } else if (*ku < 0 || *ku > *n - 1) {
	*info = -4;
    } else if (*lda < SUPERLU_MAX(1,*m)) {
	*info = -7;
    }
    if (*info < 0) {
	i__1 = -(*info);
	input_error("CLAGGE", &i__1);
	return 0;
    }

/*     initialize A to diagonal matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *m;
	for (i = 1; i <= i__2; ++i) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L10: */
	}
/* L20: */
    }
    i__1 = SUPERLU_MIN(*m,*n);
    for (i = 1; i <= i__1; ++i) {
	i__2 = i + i * a_dim1;
	i__3 = i;
	a[i__2].r = d[i__3], a[i__2].i = 0.f;
/* L30: */
    }

/*     pre- and post-multiply A by random unitary matrices */

    for (i = SUPERLU_MIN(*m,*n); i >= 1; --i) {
	if (i < *m) {

/*           generate random reflection */

	    i__1 = *m - i + 1;
	    clarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	    i__1 = *m - i + 1;
	    wn = scnrm2_(&i__1, &work[1], &c__1);
	    d__1 = wn / c_abs(&work[1]);
	    q__1.r = d__1 * work[1].r, q__1.i = d__1 * work[1].i;
	    wa.r = q__1.r, wa.i = q__1.i;
	    if (wn == 0.f) {
		tau.r = 0.f, tau.i = 0.f;
	    } else {
		q__1.r = work[1].r + wa.r, q__1.i = work[1].i + wa.i;
		wb.r = q__1.r, wb.i = q__1.i;
		i__1 = *m - i;
		c_div(&q__1, &c_b2, &wb);
		cscal_(&i__1, &q__1, &work[2], &c__1);
		work[1].r = 1.f, work[1].i = 0.f;
		c_div(&q__1, &wb, &wa);
		d__1 = q__1.r;
		tau.r = d__1, tau.i = 0.f;
	    }

/*           multiply A(i:m,i:n) by random reflection from the lef
t */

	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    cgemv_("Conjugate transpose", &i__1, &i__2, &c_b2, &a[i + i * 
		    a_dim1], lda, &work[1], &c__1, &c_b1, &work[*m + 1], &
		    c__1);
	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
	    cgerc_(&i__1, &i__2, &q__1, &work[1], &c__1, &work[*m + 1], &c__1,
		     &a[i + i * a_dim1], lda);
	}
	if (i < *n) {

/*           generate random reflection */

	    i__1 = *n - i + 1;
	    clarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	    i__1 = *n - i + 1;
	    wn = scnrm2_(&i__1, &work[1], &c__1);
	    d__1 = wn / c_abs(&work[1]);
	    q__1.r = d__1 * work[1].r, q__1.i = d__1 * work[1].i;
	    wa.r = q__1.r, wa.i = q__1.i;
	    if (wn == 0.f) {
		tau.r = 0.f, tau.i = 0.f;
	    } else {
		q__1.r = work[1].r + wa.r, q__1.i = work[1].i + wa.i;
		wb.r = q__1.r, wb.i = q__1.i;
		i__1 = *n - i;
		c_div(&q__1, &c_b2, &wb);
		cscal_(&i__1, &q__1, &work[2], &c__1);
		work[1].r = 1.f, work[1].i = 0.f;
		c_div(&q__1, &wb, &wa);
		d__1 = q__1.r;
		tau.r = d__1, tau.i = 0.f;
	    }

/*           multiply A(i:m,i:n) by random reflection from the rig
ht */

	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    cgemv_("No transpose", &i__1, &i__2, &c_b2, &a[i + i * a_dim1], 
		    lda, &work[1], &c__1, &c_b1, &work[*n + 1], &c__1);
	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
	    cgerc_(&i__1, &i__2, &q__1, &work[*n + 1], &c__1, &work[1], &c__1,
		     &a[i + i * a_dim1], lda);
	}
/* L40: */
    }

/*     Reduce number of subdiagonals to KL and number of superdiagonals   
       to KU   

   Computing MAX */
    i__2 = *m - 1 - *kl, i__3 = *n - 1 - *ku;
    i__1 = SUPERLU_MAX(i__2,i__3);
    for (i = 1; i <= i__1; ++i) {
	if (*kl <= *ku) {

/*           annihilate subdiagonal elements first (necessary if K
L = 0)   

   Computing MIN */
	    i__2 = *m - 1 - *kl;
	    if (i <= SUPERLU_MIN(i__2,*n)) {

/*              generate reflection to annihilate A(kl+i+1:m,i
) */

		i__2 = *m - *kl - i + 1;
		wn = scnrm2_(&i__2, &a[*kl + i + i * a_dim1], &c__1);
		d__1 = wn / c_abs(&a[*kl + i + i * a_dim1]);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = *kl + i + i * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *m - *kl - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[*kl + i + 1 + i * a_dim1], &c__1);
		    i__2 = *kl + i + i * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(kl+i:m,i+1:n) from the l
eft */

		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		cgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*kl + i 
			+ (i + 1) * a_dim1], lda, &a[*kl + i + i * a_dim1], &
			c__1, &c_b1, &work[1], &c__1);
		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &a[*kl + i + i * a_dim1], &c__1, &
			work[1], &c__1, &a[*kl + i + (i + 1) * a_dim1], lda);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }

/* Computing MIN */
	    i__2 = *n - 1 - *ku;
	    if (i <= SUPERLU_MIN(i__2,*m)) {

/*              generate reflection to annihilate A(i,ku+i+1:n
) */

		i__2 = *n - *ku - i + 1;
		wn = scnrm2_(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		d__1 = wn / c_abs(&a[i + (*ku + i) * a_dim1]);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = i + (*ku + i) * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *n - *ku - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[i + (*ku + i + 1) * a_dim1], lda);
		    i__2 = i + (*ku + i) * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(i+1:m,ku+i:n) from the r
ight */

		i__2 = *n - *ku - i + 1;
		clacgv_slu(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		cgemv_("No transpose", &i__2, &i__3, &c_b2, &a[i + 1 + (*ku + 
			i) * a_dim1], lda, &a[i + (*ku + i) * a_dim1], lda, &
			c_b1, &work[1], &c__1);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &work[1], &c__1, &a[i + (*ku + i) 
			* a_dim1], lda, &a[i + 1 + (*ku + i) * a_dim1], lda);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }
	} else {

/*           annihilate superdiagonal elements first (necessary if
   
             KU = 0)   

   Computing MIN */
	    i__2 = *n - 1 - *ku;
	    if (i <= SUPERLU_MIN(i__2,*m)) {

/*              generate reflection to annihilate A(i,ku+i+1:n
) */

		i__2 = *n - *ku - i + 1;
		wn = scnrm2_(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		d__1 = wn / c_abs(&a[i + (*ku + i) * a_dim1]);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = i + (*ku + i) * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *n - *ku - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[i + (*ku + i + 1) * a_dim1], lda);
		    i__2 = i + (*ku + i) * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(i+1:m,ku+i:n) from the r
ight */

		i__2 = *n - *ku - i + 1;
		clacgv_slu(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		cgemv_("No transpose", &i__2, &i__3, &c_b2, &a[i + 1 + (*ku + 
			i) * a_dim1], lda, &a[i + (*ku + i) * a_dim1], lda, &
			c_b1, &work[1], &c__1);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &work[1], &c__1, &a[i + (*ku + i) 
			* a_dim1], lda, &a[i + 1 + (*ku + i) * a_dim1], lda);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }

/* Computing MIN */
	    i__2 = *m - 1 - *kl;
	    if (i <= SUPERLU_MIN(i__2,*n)) {

/*              generate reflection to annihilate A(kl+i+1:m,i
) */

		i__2 = *m - *kl - i + 1;
		wn = scnrm2_(&i__2, &a[*kl + i + i * a_dim1], &c__1);
		d__1 = wn / c_abs(&a[*kl + i + i * a_dim1]);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = *kl + i + i * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *m - *kl - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[*kl + i + 1 + i * a_dim1], &c__1);
		    i__2 = *kl + i + i * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(kl+i:m,i+1:n) from the l
eft */

		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		cgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*kl + i 
			+ (i + 1) * a_dim1], lda, &a[*kl + i + i * a_dim1], &
			c__1, &c_b1, &work[1], &c__1);
		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &a[*kl + i + i * a_dim1], &c__1, &
			work[1], &c__1, &a[*kl + i + (i + 1) * a_dim1], lda);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }
	}

	i__2 = *m;
	for (j = *kl + i + 1; j <= i__2; ++j) {
	    i__3 = j + i * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L50: */
	}

	i__2 = *n;
	for (j = *ku + i + 1; j <= i__2; ++j) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L60: */
	}
/* L70: */
    }
    return 0;

/*     End of CLAGGE */

}